

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O3

void add_symbol_value(ListNode *symbol_map_head,char **symbol_names,size_t number_of_symbol_names,
                     void *value,int refcount)

{
  char *value_00;
  int iVar1;
  undefined8 *value_01;
  ListNode *pLVar2;
  long in_FS_OFFSET;
  ListNode *local_40;
  long local_38;
  
  while( true ) {
    local_38 = *(long *)(in_FS_OFFSET + 0x28);
    if (symbol_map_head == (ListNode *)0x0) {
      cm_print_error("%s\n","symbol_map_head");
      _fail("/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/build_O3/_deps/cmocka-src/src/cmocka.c"
            ,0x2ee);
    }
    if (symbol_names == (char **)0x0) {
      cm_print_error("%s\n","symbol_names");
      _fail("/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/build_O3/_deps/cmocka-src/src/cmocka.c"
            ,0x2ef);
    }
    if (number_of_symbol_names == 0) {
      cm_print_error("%s\n","number_of_symbol_names");
      _fail("/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/build_O3/_deps/cmocka-src/src/cmocka.c"
            ,0x2f0);
    }
    value_00 = *symbol_names;
    iVar1 = list_find(symbol_map_head,value_00,(EqualityFunction)&local_40,(ListNode **)value);
    pLVar2 = local_40;
    if (iVar1 == 0) {
      value_01 = (undefined8 *)malloc(0x28);
      *value_01 = value_00;
      value_01[1] = 0;
      value_01[3] = value_01 + 1;
      value_01[4] = value_01 + 1;
      *(undefined4 *)(value_01 + 2) = 1;
      pLVar2 = list_add_value(symbol_map_head,value_01,1);
    }
    symbol_map_head = (ListNode *)((long)pLVar2->value + 8);
    if (number_of_symbol_names == 1) break;
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0011214b;
    symbol_names = symbol_names + 1;
    number_of_symbol_names = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    list_add_value(symbol_map_head,value,refcount);
    return;
  }
LAB_0011214b:
  __stack_chk_fail();
}

Assistant:

static void add_symbol_value(ListNode * const symbol_map_head,
                             const char * const symbol_names[],
                             const size_t number_of_symbol_names,
                             const void* value, const int refcount) {
    const char* symbol_name;
    ListNode *target_node;
    SymbolMapValue *target_map_value;
    assert_non_null(symbol_map_head);
    assert_non_null(symbol_names);
    assert_true(number_of_symbol_names);
    symbol_name = symbol_names[0];

    if (!list_find(symbol_map_head, symbol_name, symbol_names_match,
                   &target_node)) {
        SymbolMapValue * const new_symbol_map_value =
            (SymbolMapValue*)malloc(sizeof(*new_symbol_map_value));
        new_symbol_map_value->symbol_name = symbol_name;
        list_initialize(&new_symbol_map_value->symbol_values_list_head);
        target_node = list_add_value(symbol_map_head, new_symbol_map_value,
                                          1);
    }

    target_map_value = (SymbolMapValue*)target_node->value;
    if (number_of_symbol_names == 1) {
            list_add_value(&target_map_value->symbol_values_list_head,
                                value, refcount);
    } else {
        add_symbol_value(&target_map_value->symbol_values_list_head,
                         &symbol_names[1], number_of_symbol_names - 1, value,
                         refcount);
    }
}